

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_primitive_types.h
# Opt level: O0

shared_ptr<DogPrimitive> __thiscall
dukglue::types::DukType<std::shared_ptr<DogPrimitive>>::read<std::shared_ptr<DogPrimitive>>
          (DukType<std::shared_ptr<DogPrimitive>> *this,duk_context *ctx,duk_idx_t arg_idx)

{
  bool bVar1;
  duk_bool_t dVar2;
  duk_int_t type_idx_00;
  char *pcVar3;
  TypeInfo *this_00;
  shared_ptr<DogPrimitive> *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<DogPrimitive> sVar6;
  void *ptr;
  TypeInfo *info;
  duk_int_t type_idx;
  duk_idx_t arg_idx_local;
  duk_context *ctx_local;
  
  dVar2 = duk_is_null(ctx,arg_idx);
  if (dVar2 == 0) {
    dVar2 = duk_is_object(ctx,arg_idx);
    if (dVar2 == 0) {
      type_idx_00 = duk_get_type(ctx,arg_idx);
      pcVar3 = detail::get_type_name(type_idx_00);
      duk_error_raw(ctx,-6,
                    "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                    ,0xbc,"Argument %d: expected shared_ptr object, got ",(ulong)(uint)arg_idx,
                    pcVar3);
    }
    duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_d983);
    dVar2 = duk_is_pointer(ctx,-1);
    if (dVar2 == 0) {
      duk_error_raw(ctx,-6,
                    "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                    ,0xc1,"Argument %d: expected shared_ptr object (missing type_info)",
                    (ulong)(uint)arg_idx);
    }
    this_00 = (TypeInfo *)duk_get_pointer(ctx,-1);
    bVar1 = detail::TypeInfo::can_cast<DogPrimitive>(this_00);
    if (!bVar1) {
      duk_error_raw(ctx,-6,
                    "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                    ,0xc6,"Argument %d: wrong type of shared_ptr object",(ulong)(uint)arg_idx);
    }
    duk_pop(ctx);
    duk_get_prop_string(ctx,arg_idx,anon_var_dwarf_344d4);
    dVar2 = duk_is_pointer(ctx,-1);
    if (dVar2 == 0) {
      duk_error_raw(ctx,-6,
                    "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_primitive_types.h"
                    ,0xcb,"Argument %d: not a shared_ptr object (missing shared_ptr)",
                    (ulong)(uint)arg_idx);
    }
    psVar4 = (shared_ptr<DogPrimitive> *)duk_get_pointer(ctx,-1);
    duk_pop(ctx);
    std::shared_ptr<DogPrimitive>::shared_ptr((shared_ptr<DogPrimitive> *)this,psVar4);
    _Var5._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<DogPrimitive>::shared_ptr((shared_ptr<DogPrimitive> *)this,(nullptr_t)0x0);
    _Var5._M_pi = extraout_RDX;
  }
  sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi
  ;
  sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<DogPrimitive>)
         sVar6.super___shared_ptr<DogPrimitive,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<T> read(duk_context* ctx, duk_idx_t arg_idx) {
				if (duk_is_null(ctx, arg_idx))
					return nullptr;

				if (!duk_is_object(ctx, arg_idx)) {
					duk_int_t type_idx = duk_get_type(ctx, arg_idx);
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected shared_ptr object, got ", arg_idx, detail::get_type_name(type_idx));
				}

				duk_get_prop_string(ctx, arg_idx, "\xFF" "type_info");
				if (!duk_is_pointer(ctx, -1))  // missing type_info, must not be a native object
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: expected shared_ptr object (missing type_info)", arg_idx);

				// make sure this object can be safely returned as a T*
				dukglue::detail::TypeInfo* info = static_cast<dukglue::detail::TypeInfo*>(duk_get_pointer(ctx, -1));
				if (!info->can_cast<T>())
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: wrong type of shared_ptr object", arg_idx);
				duk_pop(ctx);  // pop type_info

				duk_get_prop_string(ctx, arg_idx, "\xFF" "shared_ptr");
				if (!duk_is_pointer(ctx, -1))
					duk_error(ctx, DUK_RET_TYPE_ERROR, "Argument %d: not a shared_ptr object (missing shared_ptr)", arg_idx);
				void* ptr = duk_get_pointer(ctx, -1);
				duk_pop(ctx);  // pop pointer to shared_ptr

				return *((std::shared_ptr<T>*) ptr);
			}